

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSet
          (ExtensionSet *this,CodedInputStream *input,Message *containing_type,
          UnknownFieldSet *unknown_fields)

{
  DescriptorPool *pDVar1;
  MessageFactory *factory;
  Descriptor *containing_type_00;
  undefined1 local_88 [8];
  DescriptorPoolExtensionFinder finder_1;
  undefined1 local_60 [8];
  GeneratedExtensionFinder finder;
  undefined1 local_40 [8];
  UnknownFieldSetFieldSkipper skipper;
  UnknownFieldSet *unknown_fields_local;
  Message *containing_type_local;
  CodedInputStream *input_local;
  ExtensionSet *this_local;
  
  skipper.unknown_fields_ = unknown_fields;
  UnknownFieldSetFieldSkipper::UnknownFieldSetFieldSkipper
            ((UnknownFieldSetFieldSkipper *)local_40,unknown_fields);
  pDVar1 = io::CodedInputStream::GetExtensionPool(input);
  if (pDVar1 == (DescriptorPool *)0x0) {
    GeneratedExtensionFinder::GeneratedExtensionFinder
              ((GeneratedExtensionFinder *)local_60,&containing_type->super_MessageLite);
    this_local._7_1_ =
         ParseMessageSet(this,input,(ExtensionFinder *)local_60,(FieldSkipper *)local_40);
    finder_1.containing_type_._4_4_ = 1;
    GeneratedExtensionFinder::~GeneratedExtensionFinder((GeneratedExtensionFinder *)local_60);
  }
  else {
    pDVar1 = io::CodedInputStream::GetExtensionPool(input);
    factory = io::CodedInputStream::GetExtensionFactory(input);
    containing_type_00 = Message::GetDescriptor(containing_type);
    DescriptorPoolExtensionFinder::DescriptorPoolExtensionFinder
              ((DescriptorPoolExtensionFinder *)local_88,pDVar1,factory,containing_type_00);
    this_local._7_1_ =
         ParseMessageSet(this,input,(ExtensionFinder *)local_88,(FieldSkipper *)local_40);
    finder_1.containing_type_._4_4_ = 1;
    DescriptorPoolExtensionFinder::~DescriptorPoolExtensionFinder
              ((DescriptorPoolExtensionFinder *)local_88);
  }
  UnknownFieldSetFieldSkipper::~UnknownFieldSetFieldSkipper((UnknownFieldSetFieldSkipper *)local_40)
  ;
  return this_local._7_1_;
}

Assistant:

bool ExtensionSet::ParseMessageSet(io::CodedInputStream* input,
                                   const Message* containing_type,
                                   UnknownFieldSet* unknown_fields) {
  UnknownFieldSetFieldSkipper skipper(unknown_fields);
  if (input->GetExtensionPool() == NULL) {
    GeneratedExtensionFinder finder(containing_type);
    return ParseMessageSet(input, &finder, &skipper);
  } else {
    DescriptorPoolExtensionFinder finder(input->GetExtensionPool(),
                                         input->GetExtensionFactory(),
                                         containing_type->GetDescriptor());
    return ParseMessageSet(input, &finder, &skipper);
  }
}